

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

ssl_primary_config * Curl_ssl_cf_get_primary_config(Curl_cfilter *cf)

{
  long lVar1;
  
  lVar1 = 0x1c0;
  if (cf->cft == &Curl_cft_ssl_proxy) {
    lVar1 = 0x230;
  }
  return (ssl_primary_config *)((long)&(cf->conn->bundle_node).ptr + lVar1);
}

Assistant:

struct ssl_primary_config *
Curl_ssl_cf_get_primary_config(struct Curl_cfilter *cf)
{
#ifdef CURL_DISABLE_PROXY
  return &cf->conn->ssl_config;
#else
  return Curl_ssl_cf_is_proxy(cf)?
    &cf->conn->proxy_ssl_config : &cf->conn->ssl_config;
#endif
}